

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O3

void __thiscall helics::apps::BrokerServer::BrokerServer(BrokerServer *this)

{
  this->zmq_server = true;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->zmq_ss_server = false;
  this->tcp_server = false;
  this->udp_server = false;
  this->http_server = false;
  this->websocket_server = false;
  this->exitall = (__atomic_base<bool>)0x0;
  (this->configFile_)._M_dataplus._M_p = (pointer)&(this->configFile_).field_2;
  (this->configFile_)._M_string_length = 0;
  (this->configFile_).field_2._M_local_buf[0] = '\0';
  gmlc::utilities::randomString_abi_cxx11_(0x1bc98b);
  (this->config_)._M_t.
  super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
  .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl = (JsonStorage *)0x0;
  (this->mHttpArgs)._M_dataplus._M_p = (pointer)&(this->mHttpArgs).field_2;
  (this->mHttpArgs)._M_string_length = 0;
  (this->mHttpArgs).field_2._M_local_buf[0] = '\0';
  (this->mWebSocketArgs)._M_dataplus._M_p = (pointer)&(this->mWebSocketArgs).field_2;
  (this->mWebSocketArgs)._M_string_length = 0;
  (this->mWebSocketArgs).field_2._M_local_buf[0] = '\0';
  (this->mZmqArgs)._M_dataplus._M_p = (pointer)&(this->mZmqArgs).field_2;
  (this->mZmqArgs)._M_string_length = 0;
  (this->mZmqArgs).field_2._M_local_buf[0] = '\0';
  (this->mTcpArgs)._M_dataplus._M_p = (pointer)&(this->mTcpArgs).field_2;
  (this->mTcpArgs)._M_string_length = 0;
  (this->mTcpArgs).field_2._M_local_buf[0] = '\0';
  (this->mUdpArgs)._M_dataplus._M_p = (pointer)&(this->mUdpArgs).field_2;
  (this->mUdpArgs)._M_string_length = 0;
  (this->mUdpArgs).field_2._M_local_buf[0] = '\0';
  (this->mMpiArgs)._M_dataplus._M_p = (pointer)&(this->mMpiArgs).field_2;
  (this->mMpiArgs)._M_string_length = 0;
  (this->mMpiArgs).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

BrokerServer::BrokerServer() noexcept:
    zmq_server{true}, server_name_{gmlc::utilities::randomString(5)}
{
}